

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O0

int32 get_rc_nssid(dict2pid_t *d2p,s3wid_t w)

{
  short sVar1;
  int iVar2;
  dict_t *pdVar3;
  dict_t *dict;
  s3cipid_t lc;
  s3cipid_t b;
  int32 pronlen;
  s3wid_t w_local;
  dict2pid_t *d2p_local;
  
  pdVar3 = d2p->dict;
  iVar2 = pdVar3->word[w].pronlen;
  sVar1 = pdVar3->word[w].ciphone[iVar2 + -1];
  if (iVar2 == 1) {
    d2p_local._4_4_ = d2p->lrssid[sVar1]->n_ssid;
  }
  else {
    d2p_local._4_4_ = d2p->rssid[sVar1][pdVar3->word[w].ciphone[iVar2 + -2]].n_ssid;
  }
  return d2p_local._4_4_;
}

Assistant:

int32
get_rc_nssid(dict2pid_t * d2p, s3wid_t w)
{
    int32 pronlen;
    s3cipid_t b, lc;
    dict_t *dict = d2p->dict;

    pronlen = dict->word[w].pronlen;
    b = dict->word[w].ciphone[pronlen - 1];

    if (pronlen == 1) {
        /* Is this true ?
           No known left context.  But all cimaps (for any l) are identical; pick one 
        */
        /*E_INFO("Single phone word\n"); */
        return (d2p->lrssid[b][0].n_ssid);
    }
    else {
        /*    E_INFO("Multiple phone word\n"); */
        lc = dict->word[w].ciphone[pronlen - 2];
        return (d2p->rssid[b][lc].n_ssid);
    }

}